

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyMemBackendInitFromOthers
                (SyMemBackend *pBackend,SyMemMethods *pMethods,ProcMemError xMemErr,void *pUserData)

{
  int iVar1;
  ulong uVar2;
  
  if ((((pMethods->xAlloc == (_func_void_ptr_uint *)0x0) ||
       (pMethods->xRealloc == (_func_void_ptr_void_ptr_uint *)0x0)) ||
      (pMethods->xFree == (_func_void_void_ptr *)0x0)) ||
     (pMethods->xChunkSize == (_func_uint_void_ptr *)0x0)) {
    return -9;
  }
  uVar2 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)pBackend->apPool + (uVar2 - 0x3c)) = 0;
    uVar2 = uVar2 + 4;
  } while (uVar2 < 0xb4);
  pBackend->xMemError = xMemErr;
  pBackend->pUserData = pUserData;
  pBackend->pMethods = pMethods;
  if ((pMethods->xInit != (_func_int_void_ptr *)0x0) &&
     (iVar1 = (*pMethods->xInit)(pMethods->pUserData), iVar1 != 0)) {
    return -10;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendInitFromOthers(SyMemBackend *pBackend, const SyMemMethods *pMethods, ProcMemError xMemErr, void * pUserData)
{
#if defined(UNTRUST)
	if( pBackend == 0 || pMethods == 0){
		return SXERR_EMPTY;
	}
#endif
	if( pMethods->xAlloc == 0 || pMethods->xRealloc == 0 || pMethods->xFree == 0 || pMethods->xChunkSize == 0 ){
		/* mandatory methods are missing */
		return SXERR_INVALID;
	}
	/* Zero the allocator first */
	SyZero(&(*pBackend), sizeof(SyMemBackend));
	pBackend->xMemError = xMemErr;
	pBackend->pUserData = pUserData;
	/* Switch to the host application memory allocator */
	pBackend->pMethods = pMethods;
	if( pBackend->pMethods->xInit ){
		/* Initialize the backend  */
		if( SXRET_OK != pBackend->pMethods->xInit(pBackend->pMethods->pUserData) ){
			return SXERR_ABORT;
		}
	}
#if defined(UNTRUST)
	pBackend->nMagic = SXMEM_BACKEND_MAGIC;
#endif
	return SXRET_OK;
}